

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9BCore(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  FILE *pFile_1;
  FILE *pFile;
  Bmc_BCorePar_t *pPars;
  Bmc_BCorePar_t Pars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  memset((Bmc_BCorePar_t *)&pPars,0,0x28);
  pPars._0_4_ = 10;
  pPars._4_4_ = 0;
  Pars.iFrame = 0;
  Pars.nTimeOut = 0;
  Pars._12_4_ = 0;
  Pars.pFilePivots = (char *)0x0;
  Pars.pFileProof._0_4_ = 0;
  Extra_UtilGetoptReset();
LAB_002bcf75:
  do {
    Pars._36_4_ = Extra_UtilGetopt(argc,argv,"FOTVvh");
    if (Pars._36_4_ == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9BCore(): There is no AIG.\n");
        return 0;
      }
      iVar2 = Gia_ManRegNum(pAbc->pGia);
      if (iVar2 != 0) {
        if (Pars._8_8_ != 0) {
          pFVar3 = fopen((char *)Pars._8_8_,"r");
          if (pFVar3 == (FILE *)0x0) {
            Abc_Print(-1,"Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n",
                      Pars._8_8_);
            return 0;
          }
          fclose(pFVar3);
        }
        if (argc == globalUtilOptind + 1) {
          Pars.pFilePivots = argv[globalUtilOptind];
          pFVar3 = fopen(Pars.pFilePivots,"wb");
          if (pFVar3 == (FILE *)0x0) {
            Abc_Print(-1,"Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n",
                      Pars.pFilePivots);
            return 0;
          }
          fclose(pFVar3);
        }
        Bmc_ManBCorePerform(pAbc->pGia,(Bmc_BCorePar_t *)&pPars);
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9BCore(): AIG has no registers.\n");
      return 0;
    }
    switch(Pars._36_4_) {
    case (BADTYPE)0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002bd2d1;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar1 = (uint)pPars;
      break;
    default:
      goto LAB_002bd2d1;
    case (BADTYPE)0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_002bd2d1;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar1 = pPars._4_4_;
      break;
    case (BADTYPE)0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002bd2d1;
      }
      Pars.iFrame = atoi(argv[globalUtilOptind]);
      uVar1 = Pars.iFrame;
      break;
    case (BADTYPE)0x56:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-V\" should be followed by a file name.\n");
        goto LAB_002bd2d1;
      }
      Pars._8_8_ = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002bcf75;
    case (BADTYPE)0x68:
      goto LAB_002bd2d1;
    case (BADTYPE)0x76:
      Pars.pFileProof._0_4_ = (uint)Pars.pFileProof ^ 1;
      goto LAB_002bcf75;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar1 < 0) {
LAB_002bd2d1:
      Abc_Print(-2,"usage: &bcore [-FOTV num] [-vh] <file>\n");
      Abc_Print(-2,"\t         records UNSAT core of the BMC instance\n");
      Abc_Print(-2,"\t-F num : the zero-based index of a timeframe [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-O num : the zero-based index of a primary output [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",
                (ulong)(uint)Pars.iFrame);
      Abc_Print(-2,"\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n");
      pcVar4 = "no";
      if ((uint)Pars.pFileProof != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file name to write the resulting proof [default = stdout]\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9BCore( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_BCorePar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_BCorePar_t) );
    pPars->iFrame        =   10;  // timeframe
    pPars->iOutput       =    0;  // property output
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->pFilePivots   = NULL;  // file name with AIG IDs of pivot objects
    pPars->pFileProof    = NULL;  // file name to write the resulting proof
    pPars->fVerbose      =    0;  // verbose output
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FOTVvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iFrame = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iFrame < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iOutput < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFilePivots = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): AIG has no registers.\n" );
        return 0;
    }
    // get the file name
    if ( pPars->pFilePivots != NULL )
    {
        FILE * pFile;
        pFile = fopen( pPars->pFilePivots, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n", pPars->pFilePivots );
            return 0;
        }
        fclose( pFile );
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileProof = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileProof, "wb" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n", pPars->pFileProof );
            return 0;
        }
        fclose( pFile );
    }
    Bmc_ManBCorePerform( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &bcore [-FOTV num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         records UNSAT core of the BMC instance\n" );
    Abc_Print( -2, "\t-F num : the zero-based index of a timeframe [default = %d]\n",         pPars->iFrame );
    Abc_Print( -2, "\t-O num : the zero-based index of a primary output [default = %d]\n",    pPars->iOutput );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name to write the resulting proof [default = stdout]\n");
    return 1;
}